

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O0

void flatbuffers::tests::Offset64NestedFlatBuffer(void)

{
  allocator<unsigned_char> *this;
  bool expval;
  Offset<flatbuffers::String> OVar1;
  size_t buffer_minalign;
  uint8_t *puVar2;
  String *pSVar3;
  char *pcVar4;
  uint8_t *puVar5;
  SizeT SVar6;
  RootTable *pRVar7;
  Vector64<uint8_t> *this_00;
  unsigned_long expval_00;
  size_type_conflict val;
  RootTable *root_table_1;
  Verifier verifier;
  Options options;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_178;
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_> local_16c;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_> local_168;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_> local_160;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_158;
  Offset<flatbuffers::String> local_14c;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_148;
  Offset64<flatbuffers::String> local_140;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_138;
  offset_type local_130;
  offset_type local_12c;
  Offset<RootTable> root_table_offset_1;
  Offset<flatbuffers::String> near_string_offset_1;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> nested_flatbuffer_offset;
  undefined1 local_118 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> nested_data;
  RootTable *root_table;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_f0;
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_> local_e4;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_> local_e0;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_> local_d8;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_d0;
  Offset<flatbuffers::String> local_c4;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_c0;
  Offset64<flatbuffers::String> local_b8;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_b0;
  offset_type local_a8;
  Offset<RootTable> root_table_offset;
  undefined1 local_90 [4];
  Offset<flatbuffers::String> near_string_offset;
  FlatBufferBuilder64 fbb;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<true>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)local_90,0x400,(Allocator *)0x0,false,buffer_minalign);
  OVar1 = FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset>
                    ((FlatBufferBuilderImpl<true> *)local_90,"nested: some near string");
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset64(&local_b0,0);
  Offset64<flatbuffers::String>::Offset64(&local_b8,0);
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_c0,0);
  local_c4 = OVar1;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_d0,0);
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>::Offset64(&local_d8,0);
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>::Offset64(&local_e0,0);
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>::Offset(&local_e4,0)
  ;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_f0,0);
  local_a8 = (offset_type)
             CreateRootTable((FlatBufferBuilder64 *)local_90,local_b0,0,local_b8,local_c0,local_c4,
                             local_d0,local_d8,local_e0,local_e4,local_f0);
  FlatBufferBuilderImpl<true>::Finish<RootTable>
            ((FlatBufferBuilderImpl<true> *)local_90,(Offset<RootTable>)local_a8,(char *)0x0);
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_90);
  nested_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)GetRootTable(puVar2);
  pSVar3 = RootTable::near_string
                     ((RootTable *)
                      nested_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar4 = String::c_str(pSVar3);
  TestEqStr(pcVar4,"nested: some near string",
            "\'root_table->near_string()->c_str()\' != \'\"nested: some near string\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0x80,"");
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_90);
  puVar5 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_90);
  SVar6 = FlatBufferBuilderImpl<true>::GetSize((FlatBufferBuilderImpl<true> *)local_90);
  this = (allocator<unsigned_char> *)((long)&nested_flatbuffer_offset.o + 7);
  std::allocator<unsigned_char>::allocator(this);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_118,puVar2,puVar5 + SVar6,
             this);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&nested_flatbuffer_offset.o + 7));
  FlatBufferBuilderImpl<true>::Clear((FlatBufferBuilderImpl<true> *)local_90);
  _root_table_offset_1 =
       FlatBufferBuilderImpl<true>::CreateVector64<flatbuffers::Vector64,_unsigned_char>
                 ((FlatBufferBuilderImpl<true> *)local_90,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118);
  local_12c = (offset_type)
              FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset>
                        ((FlatBufferBuilderImpl<true> *)local_90,"some near string");
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>::Offset64(&local_138,0);
  Offset64<flatbuffers::String>::Offset64(&local_140,0);
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_148,0);
  local_14c.o = local_12c;
  local_158.o = _root_table_offset_1;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>::Offset64(&local_160,0);
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>::Offset64(&local_168,0);
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>::Offset
            (&local_16c,0);
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>::Offset64(&local_178,0);
  local_130 = (offset_type)
              CreateRootTable((FlatBufferBuilder64 *)local_90,local_138,0,local_140,local_148,
                              local_14c,local_158,local_160,local_168,local_16c,local_178);
  FlatBufferBuilderImpl<true>::Finish<RootTable>
            ((FlatBufferBuilderImpl<true> *)local_90,(Offset<RootTable>)local_130,(char *)0x0);
  VerifierTemplate<false>::Options::Options((Options *)&verifier.flex_reuse_tracker_);
  std::numeric_limits<long>::max();
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_90);
  SVar6 = FlatBufferBuilderImpl<true>::GetSize((FlatBufferBuilderImpl<true> *)local_90);
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&root_table_1,puVar2,SVar6,
             (Options *)&verifier.flex_reuse_tracker_);
  expval = VerifyRootTableBuffer((Verifier *)&root_table_1);
  TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0xa0,"");
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer((FlatBufferBuilderImpl<true> *)local_90);
  pRVar7 = GetRootTable(puVar2);
  pSVar3 = RootTable::near_string(pRVar7);
  pcVar4 = String::c_str(pSVar3);
  TestEqStr(pcVar4,"some near string",
            "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0xa7,"");
  this_00 = RootTable::nested_root(pRVar7);
  expval_00 = Vector<unsigned_char,_unsigned_long>::size(this_00);
  val = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118);
  TestEq<unsigned_long,unsigned_long>
            (expval_00,val,"\'root_table->nested_root()->size()\' != \'nested_data.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0xaa,"");
  pRVar7 = RootTable::nested_root_nested_root(pRVar7);
  pSVar3 = RootTable::near_string(pRVar7);
  pcVar4 = String::c_str(pSVar3);
  TestEqStr(pcVar4,"nested: some near string",
            "\'root_table->nested_root_nested_root()->near_string()->c_str()\' != \'\"nested: some near string\"\'"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0xae,"");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118);
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<true> *)local_90);
  return;
}

Assistant:

void Offset64NestedFlatBuffer() {
  FlatBufferBuilder64 fbb;

  // First serialize a nested buffer.
  const Offset<String> near_string_offset =
      fbb.CreateString("nested: some near string");

  // Finish by building the root table by passing in all the offsets.
  const Offset<RootTable> root_table_offset =
      CreateRootTable(fbb, 0, 0, 0, 0, near_string_offset, 0);

  // Finish the buffer.
  fbb.Finish(root_table_offset);

  // Ensure the buffer is valid.
  const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());
  TEST_EQ_STR(root_table->near_string()->c_str(), "nested: some near string");

  // Copy the data out of the builder.
  std::vector<uint8_t> nested_data{ fbb.GetBufferPointer(),
                                    fbb.GetBufferPointer() + fbb.GetSize() };

  {
    // Clear so we can reuse the builder.
    fbb.Clear();

    const Offset64<Vector64<uint8_t>> nested_flatbuffer_offset =
        fbb.CreateVector64<Vector64>(nested_data);

    // Now that we are done with the 64-bit fields, we can create and add the
    // normal fields.
    const Offset<String> near_string_offset =
        fbb.CreateString("some near string");

    // Finish by building the root table by passing in all the offsets.
    const Offset<RootTable> root_table_offset = CreateRootTable(
        fbb, 0, 0, 0, 0, near_string_offset, nested_flatbuffer_offset);

    // Finish the buffer.
    fbb.Finish(root_table_offset);

    Verifier::Options options;
    // Allow the verifier to verify 64-bit buffers.
    options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
    options.assert = true;

    Verifier verifier(fbb.GetBufferPointer(), fbb.GetSize(), options);

    TEST_EQ(VerifyRootTableBuffer(verifier), true);
  }

  {
    const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());

    // Test that the parent buffer field is ok.
    TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");

    // Expect nested buffer to be properly sized.
    TEST_EQ(root_table->nested_root()->size(), nested_data.size());

    // Expect the direct accessors to the nested buffer work.
    TEST_EQ_STR(root_table->nested_root_nested_root()->near_string()->c_str(),
                "nested: some near string");
  }
}